

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

size_t __thiscall google::protobuf::MessageOptions::ByteSizeLong(MessageOptions *this)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  Type *this_00;
  uint index;
  
  sVar5 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    sVar6 = internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
    sVar5 = sVar5 + sVar6;
  }
  uVar1 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  sVar5 = sVar5 + (ulong)uVar1 * 2;
  if ((ulong)uVar1 != 0) {
    index = 0;
    do {
      this_00 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                          (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,index);
      sVar6 = UninterpretedOption::ByteSizeLong(this_00);
      uVar4 = (uint)sVar6 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar5 = sVar5 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar1 != index);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0xf) != 0) {
    sVar5 = sVar5 + (uVar1 & 2) + (ulong)(uVar1 & 1) * 2 +
            (ulong)(uVar1 >> 2 & 2) + (ulong)(uVar1 >> 1 & 2);
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t MessageOptions::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.MessageOptions)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  {
    unsigned int count = this->uninterpreted_option_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->uninterpreted_option(i));
    }
  }

  if (_has_bits_[0 / 32] & 15u) {
    // optional bool message_set_wire_format = 1 [default = false];
    if (has_message_set_wire_format()) {
      total_size += 1 + 1;
    }

    // optional bool no_standard_descriptor_accessor = 2 [default = false];
    if (has_no_standard_descriptor_accessor()) {
      total_size += 1 + 1;
    }

    // optional bool deprecated = 3 [default = false];
    if (has_deprecated()) {
      total_size += 1 + 1;
    }

    // optional bool map_entry = 7;
    if (has_map_entry()) {
      total_size += 1 + 1;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}